

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

NodeArray __thiscall
anon_unknown.dwarf_4afdb9::Db::popTrailingNodeArray(Db *this,size_t FromPosition)

{
  Node **ppNVar1;
  Node **end;
  NodeArray NVar2;
  
  ppNVar1 = (this->Names).First;
  end = (this->Names).Last;
  if ((ulong)((long)end - (long)ppNVar1 >> 3) < FromPosition) {
    __assert_fail("FromPosition <= Names.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                  ,0x7d5,"NodeArray (anonymous namespace)::Db::popTrailingNodeArray(size_t)");
  }
  NVar2 = (anonymous_namespace)::Db::makeNodeArray<(anonymous_namespace)::Node**>
                    ((Db *)this,ppNVar1 + FromPosition,end);
  ppNVar1 = (this->Names).First;
  if (FromPosition <= (ulong)((long)(this->Names).Last - (long)ppNVar1 >> 3)) {
    (this->Names).Last = ppNVar1 + FromPosition;
    return NVar2;
  }
  __assert_fail("Index <= size() && \"dropBack() can\'t expand!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                ,0x780,
                "void (anonymous namespace)::PODSmallVector<(anonymous namespace)::Node *, 32>::dropBack(size_t) [T = (anonymous namespace)::Node *, N = 32]"
               );
}

Assistant:

size_t size() const { return static_cast<size_t>(Last - First); }